

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaMethodBuilder::tag(QByteArray *__return_storage_ptr__,QMetaMethodBuilder *this)

{
  QMetaMethodBuilderPrivate *pQVar1;
  
  pQVar1 = d_func(this);
  if (pQVar1 == (QMetaMethodBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&(pQVar1->tag).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaMethodBuilder::tag() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->tag;
    else
        return QByteArray();
}